

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O3

int Abc_ObjSopSimulate(Abc_Obj_t *pObj)

{
  byte *pSop;
  int iVar1;
  byte *pbVar2;
  uint uVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  
  pSop = (byte *)(pObj->field_5).pData;
  if ((pSop == (byte *)0x0) || (iVar1 = Abc_SopIsExorType((char *)pSop), iVar1 != 0)) {
    __assert_fail("pSop && !Abc_SopIsExorType(pSop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retInit.c"
                  ,0x61,"int Abc_ObjSopSimulate(Abc_Obj_t *)");
  }
  iVar1 = Abc_SopGetVarNum((char *)pSop);
  bVar5 = *pSop;
  if (bVar5 == 0) {
    uVar7 = 0;
LAB_0045b944:
    iVar1 = Abc_SopGetPhase((char *)pSop);
    return iVar1 == 0 ^ uVar7;
  }
  uVar7 = 0;
  pbVar2 = pSop;
LAB_0045b8cb:
  uVar3 = 1;
  lVar4 = 0;
  do {
    if (bVar5 < 0x31) {
      if (bVar5 == 0x30) {
        uVar6 = *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar4]] + 0x40) ^ 1
        ;
LAB_0045b91b:
        uVar3 = uVar3 & uVar6;
      }
      else if ((bVar5 == 0) || (bVar5 == 0x20)) break;
    }
    else if (bVar5 == 0x31) {
      uVar6 = *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar4]] + 0x40);
      goto LAB_0045b91b;
    }
    bVar5 = pbVar2[lVar4 + 1];
    lVar4 = lVar4 + 1;
  } while( true );
  uVar7 = uVar7 | uVar3;
  bVar5 = pbVar2[iVar1 + 3];
  pbVar2 = pbVar2 + (iVar1 + 3);
  if (bVar5 == 0) goto LAB_0045b944;
  goto LAB_0045b8cb;
}

Assistant:

int Abc_ObjSopSimulate( Abc_Obj_t * pObj )
{
    char * pCube, * pSop = (char *)pObj->pData;
    int nVars, Value, v, ResOr, ResAnd, ResVar;
    assert( pSop && !Abc_SopIsExorType(pSop) );
    // simulate the SOP of the node
    ResOr = 0;
    nVars = Abc_SopGetVarNum(pSop);
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        ResAnd = 1;
        Abc_CubeForEachVar( pCube, Value, v )
        {
            if ( Value == '0' )
                ResVar = 1 ^ ((int)(ABC_PTRUINT_T)Abc_ObjFanin(pObj, v)->pCopy);
            else if ( Value == '1' )
                ResVar = (int)(ABC_PTRUINT_T)Abc_ObjFanin(pObj, v)->pCopy;
            else
                continue;
            ResAnd &= ResVar;
        }
        ResOr |= ResAnd;
    }
    // complement the result if necessary
    if ( !Abc_SopGetPhase(pSop) )
        ResOr ^= 1;
    return ResOr;
}